

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_ipclisten.c
# Opt level: O3

int ipc_remove_stale(char *path)

{
  int in_EAX;
  int __fd;
  int iVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  undefined1 local_86 [8];
  sockaddr_un sa;
  
  if (path != (char *)0x0) {
    local_86._0_2_ = 1;
    sVar3 = nni_strlcpy(local_86 + 2,path,0x6c);
    if (sVar3 < 0x6c) {
      __fd = socket(1,0x80001,0);
      if (__fd < 0) {
        piVar4 = __errno_location();
        uVar2 = nni_plat_errno(*piVar4);
        sVar3 = (size_t)uVar2;
      }
      else {
        fcntl(__fd,4,0x800);
        iVar1 = connect(__fd,(sockaddr *)local_86,0x6e);
        if (iVar1 < 0) {
          piVar4 = __errno_location();
          if (*piVar4 == 0x6f) {
            unlink(path);
          }
        }
        uVar2 = close(__fd);
        sVar3 = (size_t)uVar2;
      }
    }
    in_EAX = (int)sVar3;
  }
  return in_EAX;
}

Assistant:

static int
ipc_remove_stale(const char *path)
{
	int                fd;
	struct sockaddr_un sa;
	size_t             sz;

	if (path == NULL) {
		return (0);
	}

	sa.sun_family = AF_UNIX;
	sz            = sizeof(sa.sun_path);

	if (nni_strlcpy(sa.sun_path, path, sz) >= sz) {
		return (NNG_EADDRINVAL);
	}

	if ((fd = socket(AF_UNIX, SOCK_STREAM | SOCK_CLOEXEC, 0)) < 0) {
		return (nni_plat_errno(errno));
	}

	// There is an assumption here that connect() returns immediately
	// (even when non-blocking) when a server is absent.  This seems
	// to be true for the platforms we've tried.  If it doesn't work,
	// then the cleanup will fail.  As this is supposed to be an
	// exceptional case, don't worry.
	(void) fcntl(fd, F_SETFL, O_NONBLOCK);
	if (connect(fd, (void *) &sa, sizeof(sa)) < 0) {
		if (errno == ECONNREFUSED) {
			(void) unlink(path);
		}
	}
	(void) close(fd);
	return (0);
}